

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonstats.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  char *__s_00;
  size_t sVar1;
  ostream *poVar2;
  stat_t s;
  allocator<char> local_99;
  string_view local_98;
  stat_t local_80;
  
  if (1 < argc) {
    __s = argv[1];
    if (argc != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: ignoring everything after ",0x23);
      __s_00 = argv[2];
      if (__s_00 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106100);
      }
      else {
        sVar1 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s_00,sVar1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    local_98._M_len = 0;
    local_98._M_str = (char *)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_99);
    local_98 = (string_view)get_corpus((string *)&local_80);
    if ((size_t *)local_80.integer_count != &local_80.string_count) {
      operator_delete((void *)local_80.integer_count,local_80.string_count + 1);
    }
    simdjson_computestats(&local_80,&local_98);
    if (local_80.valid == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"not a valid JSON",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    else {
      puts(
          "# integer_count float_count string_count backslash_count nonasciibyte_count object_count array_count null_count true_count false_count byte_count structural_indexes_count"
          );
      printf("%zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu\n",local_80.integer_count,
             local_80.float_count,local_80.string_count,local_80.backslash_count,
             local_80.nonasciibyte_count,local_80.object_count,local_80.array_count,
             local_80.null_count,local_80.true_count,local_80.false_count,local_80.byte_count,
             local_80.structural_indexes_count);
    }
    return (uint)(local_80.valid == false);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Reads json, prints stats. ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar2 = std::operator<<(poVar2,*argv);
  poVar2 = std::operator<<(poVar2," <jsonfile>");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  int optind = 1;
  if (optind >= argc) {
    cerr << "Reads json, prints stats. " << endl;
    cerr << "Usage: " << argv[0] << " <jsonfile>" << endl;

    exit(1);
  }
  const char *filename = argv[optind];
  if (optind + 1 < argc) {
    std::cerr << "warning: ignoring everything after " << argv[optind + 1] << std::endl;
  }
  std::string_view p;
  try {
    p = get_corpus(filename);
  } catch (const std::exception &e) { // caught by reference to base
    std::cerr << "Could not load the file " << filename << std::endl;
    return EXIT_FAILURE;
  }
  stat_t s =  simdjson_computestats(p);
  if(!s.valid) {
    std::cerr << "not a valid JSON" << std::endl;
    return EXIT_FAILURE;
  }


  printf("# integer_count float_count string_count backslash_count nonasciibyte_count object_count array_count null_count true_count false_count byte_count structural_indexes_count\n");
  printf("%zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu\n", s.integer_count, s.float_count,
  s.string_count, s.backslash_count, s.nonasciibyte_count, s.object_count, s.array_count,
  s.null_count, s.true_count, s.false_count, s.byte_count, s.structural_indexes_count);
  return EXIT_SUCCESS;
}